

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void X86_Intel_printInst(MCInst *MI,SStream *O,void *Info)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  x86_reg id;
  uint id_00;
  cs_struct *h;
  char *in_RSI;
  MCInst *in_RDI;
  SStream *unaff_retaddr;
  MCInst *in_stack_00000008;
  uint8_t access [6];
  cs_ac_type access2;
  cs_ac_type access1;
  x86_reg reg2;
  x86_reg reg;
  char *mnem;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcb;
  undefined4 in_stack_ffffffffffffffcc;
  cs_ac_type in_stack_ffffffffffffffd0;
  cs_ac_type in_stack_ffffffffffffffd4;
  x86_reg local_28;
  
  if (in_RDI->assembly[0] == '\0') {
    h = (cs_struct *)printAliasInstr(in_stack_00000008,unaff_retaddr,in_RDI);
    if (h == (cs_struct *)0x0) {
      printInstruction((MCInst *)Info,(SStream *)mnem,_reg2);
    }
    else {
      (*cs_mem_free)(h);
    }
    MCInst_getOpcode(in_RDI);
    id = X86_insn_reg_intel(in_stack_ffffffffffffffd0,
                            (cs_ac_type *)
                            CONCAT44(in_stack_ffffffffffffffcc,
                                     CONCAT13(in_stack_ffffffffffffffcb,
                                              CONCAT12(in_stack_ffffffffffffffca,
                                                       in_stack_ffffffffffffffc8))));
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      memset(&stack0xffffffffffffffca,0,6);
      if (id == X86_REG_INVALID) {
        id_00 = MCInst_getOpcode(in_RDI);
        _Var2 = X86_insn_reg_intel2(id_00,(x86_reg *)&stack0xffffffffffffffdc,
                                    (cs_ac_type *)&stack0xffffffffffffffd4,&local_28,
                                    (cs_ac_type *)&stack0xffffffffffffffd0);
        if (_Var2) {
          (in_RDI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
          (in_RDI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = id;
          *(uint8_t *)((long)&in_RDI->flat_insn->detail->field_6 + 0x68) =
               in_RDI->csh->regsize_map[id];
          *(char *)((long)&in_RDI->flat_insn->detail->field_6 + 0x69) =
               (char)in_stack_ffffffffffffffd4;
          (in_RDI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
          (in_RDI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = local_28;
          *(uint8_t *)((long)&in_RDI->flat_insn->detail->field_6 + 0x98) =
               in_RDI->csh->regsize_map[local_28];
          *(char *)((long)&in_RDI->flat_insn->detail->field_6 + 0x99) =
               (char)in_stack_ffffffffffffffd0;
          (in_RDI->flat_insn->detail->field_6).x86.op_count = '\x02';
        }
      }
      else {
        memmove((void *)((long)&in_RDI->flat_insn->detail->field_6 + 0x78),
                (void *)((long)&in_RDI->flat_insn->detail->field_6 + 0x48),0x150);
        (in_RDI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
        (in_RDI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = id;
        *(uint8_t *)((long)&in_RDI->flat_insn->detail->field_6 + 0x68) =
             in_RDI->csh->regsize_map[id];
        *(char *)((long)&in_RDI->flat_insn->detail->field_6 + 0x69) =
             (char)in_stack_ffffffffffffffd4;
        pcVar1 = in_RDI->flat_insn->detail;
        (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
      }
      MCInst_getOpcode(in_RDI);
      get_op_access(h,id,(uint8_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (uint64_t *)
                    CONCAT44(in_stack_ffffffffffffffcc,
                             CONCAT13(in_stack_ffffffffffffffcb,
                                      CONCAT12(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8))
                            ));
      *(undefined1 *)((long)&in_RDI->flat_insn->detail->field_6 + 0x69) = in_stack_ffffffffffffffca;
      *(undefined1 *)((long)&in_RDI->flat_insn->detail->field_6 + 0x99) = in_stack_ffffffffffffffcb;
    }
    if ((in_RDI->op1_size == '\0') && (id != X86_REG_INVALID)) {
      in_RDI->op1_size = in_RDI->csh->regsize_map[id];
    }
  }
  else {
    strncpy(in_RSI,in_RDI->assembly,0x200);
  }
  return;
}

Assistant:

void X86_Intel_printInst(MCInst *MI, SStream *O, void *Info)
{
#ifndef CAPSTONE_DIET
	char *mnem;
#endif
	x86_reg reg, reg2;
	enum cs_ac_type access1, access2;

	// perhaps this instruction does not need printer
	if (MI->assembly[0]) {
		strncpy(O->buffer, MI->assembly, sizeof(O->buffer));
		return;
	}

#ifndef CAPSTONE_DIET
	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, Info);
	if (mnem)
		cs_mem_free(mnem);
	else
#endif
		printInstruction(MI, O, Info);

	reg = X86_insn_reg_intel(MCInst_getOpcode(MI), &access1);
	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access[6] = {0};
#endif

		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.operands[0].access = access1;
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_intel2(MCInst_getOpcode(MI), &reg, &access1, &reg2, &access2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[0].access = access1;
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.operands[1].access = access2;
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}

#ifndef CAPSTONE_DIET
		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[0].access = access[0];
		MI->flat_insn->detail->x86.operands[1].access = access[1];
#endif
	}

	if (MI->op1_size == 0 && reg)
		MI->op1_size = MI->csh->regsize_map[reg];
}